

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

bool __thiscall
Lowerer::GenerateFastCmEqLikely(Lowerer *this,Instr *instr,bool *pNeedHelper,bool isInHelper)

{
  OpCode OVar1;
  Opnd *pOVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  ushort uVar6;
  OpCode branchOpCode;
  uint uVar7;
  LibraryValue valueType;
  undefined4 *puVar8;
  OpCode *pOVar9;
  LabelInstr *pLVar10;
  LabelInstr *branchTarget;
  LabelInstr *labelHelper;
  Opnd *pOVar11;
  BranchInstr *pBVar12;
  Lowerer *this_00;
  byte local_38;
  
  *pNeedHelper = false;
  uVar7 = *(int *)&instr->m_opcode - 0x3b;
  if (((ushort)uVar7 < 8) && ((0xe1U >> (uVar7 & 0x1f) & 1) != 0)) {
    pOVar9 = (OpCode *)(&DAT_0103a330 + (ulong)(uVar7 & 0xffff) * 2);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5e60,
                       "(instr->m_opcode == Js::OpCode::CmSrEq_A || instr->m_opcode == Js::OpCode::CmSrNeq_A || instr->m_opcode == Js::OpCode::CmEq_A || instr->m_opcode == Js::OpCode::CmNeq_A)"
                       ,
                       "instr->m_opcode == Js::OpCode::CmSrEq_A || instr->m_opcode == Js::OpCode::CmSrNeq_A || instr->m_opcode == Js::OpCode::CmEq_A || instr->m_opcode == Js::OpCode::CmNeq_A"
                      );
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    pOVar9 = &instr->m_opcode;
    *puVar8 = 0;
  }
  OVar1 = *pOVar9;
  uVar6 = OVar1 - CmNeq_A;
  branchOpCode = BrEq_A;
  if (2 >= uVar6) {
    branchOpCode = (OpCode)(0x140014000c >> ((char)uVar6 * '\x10' & 0x3fU));
  }
  pOVar2 = instr->m_src1;
  pOVar11 = instr->m_src2;
  pLVar10 = IR::LabelInstr::New(Label,this->m_func,isInHelper);
  branchTarget = IR::LabelInstr::New(Label,this->m_func,isInHelper);
  labelHelper = IR::LabelInstr::New(Label,this->m_func,true);
  bVar4 = GenerateFastBooleanAndObjectEqLikely
                    (this,instr,pOVar2,pOVar11,labelHelper,pLVar10,pNeedHelper,isInHelper);
  if (bVar4) {
    local_38 = (byte)OVar1;
    IR::Instr::InsertBefore(instr,&pLVar10->super_Instr);
    uVar7 = (2 < uVar6 | local_38) & 1;
    valueType = ValueFalse - uVar7;
    bVar5 = IR::Opnd::IsEqual(pOVar2,pOVar11);
    if (bVar5) {
      pOVar2 = instr->m_dst;
      pOVar11 = LoadLibraryValueOpnd(this,instr,valueType);
      InsertMove(pOVar2,pOVar11,instr,true);
    }
    else {
      this_00 = (Lowerer *)0x176;
      pLVar10 = IR::LabelInstr::New(Label,this->m_func,isInHelper);
      InsertCompareBranch(this_00,pOVar2,pOVar11,branchOpCode,false,pLVar10,instr,false);
      pOVar2 = instr->m_dst;
      pOVar11 = LoadLibraryValueOpnd(this,instr,uVar7 + ValueTrue);
      InsertMove(pOVar2,pOVar11,instr,true);
      pBVar12 = IR::BranchInstr::New(JMP,branchTarget,this->m_func);
      IR::Instr::InsertBefore(instr,&pBVar12->super_Instr);
      IR::Instr::InsertBefore(instr,&pLVar10->super_Instr);
      pOVar2 = instr->m_dst;
      pOVar11 = LoadLibraryValueOpnd(this,instr,valueType);
      InsertMove(pOVar2,pOVar11,instr,true);
    }
    pBVar12 = IR::BranchInstr::New(JMP,branchTarget,this->m_func);
    IR::Instr::InsertBefore(instr,&pBVar12->super_Instr);
    IR::Instr::InsertBefore(instr,&labelHelper->super_Instr);
    IR::Instr::InsertAfter(instr,&branchTarget->super_Instr);
  }
  return bVar4;
}

Assistant:

bool Lowerer::GenerateFastCmEqLikely(IR::Instr * instr, bool *pNeedHelper, bool isInHelper)
{
    *pNeedHelper = false;

    Assert(instr->m_opcode == Js::OpCode::CmSrEq_A ||
        instr->m_opcode == Js::OpCode::CmSrNeq_A   ||
        instr->m_opcode == Js::OpCode::CmEq_A      ||
        instr->m_opcode == Js::OpCode::CmNeq_A);

    bool isNegOp = false;
    bool isStrict = false;
    switch (instr->m_opcode)
    {
    case Js::OpCode::CmSrEq_A:
        isStrict = true;
        break;

    case Js::OpCode::CmSrNeq_A:
        isStrict = true;
    case Js::OpCode::CmNeq_A:
        isNegOp = true;
        break;
    }

    IR::Opnd *src1 = instr->GetSrc1();
    IR::Opnd *src2 = instr->GetSrc2();

    IR::LabelInstr *labelEqualLikely = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, isInHelper);
    IR::LabelInstr *labelDone = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, isInHelper);
    IR::LabelInstr *labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);

    if (!this->GenerateFastBooleanAndObjectEqLikely(instr, src1, src2, labelHelper, labelEqualLikely, pNeedHelper, isInHelper))
    {
        return false;
    }

    instr->InsertBefore(labelEqualLikely);

    // $labelEqualLikely
    //
    // Will only come here for
    //   if src2 is dynamic object(matches Js::DynamicObject::`vtable'), for non strict cm both src1 and src2 should be dynamic object
    //   or if src2 is builtin recyclableobject(typeId > TypeIds_LastStaticType && typeId <= TypeIds_LastBuiltinDynamicObject)
    //   or if CustomExternalType with no operations usage flags
    //
    //  src1->IsEqual(src2)
    //      MOV DST SUCCESS
    //      JMP $DONE
    //  CMP src1, src2
    //      MOV DST SUCCESS
    //      JEQ $DONE
    //      MOV DST FAILURE
    //      JMP $DONE

    LibraryValue successValueType = !isNegOp ? LibraryValue::ValueTrue : LibraryValue::ValueFalse;
    LibraryValue failureValueType = !isNegOp ? LibraryValue::ValueFalse : LibraryValue::ValueTrue;

    if (src1->IsEqual(src2))
    {
        Lowerer::InsertMove(instr->GetDst(), this->LoadLibraryValueOpnd(instr, successValueType), instr);
        instr->InsertBefore(IR::BranchInstr::New(this->m_lowererMD.MDUncondBranchOpcode, labelDone, this->m_func));
    }
    else
    {
        IR::LabelInstr *cmEqual = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, isInHelper);
        this->InsertCompareBranch(src1, src2, isStrict ? Js::OpCode::BrSrEq_A : Js::OpCode::BrEq_A, cmEqual, instr);
        Lowerer::InsertMove(instr->GetDst(), this->LoadLibraryValueOpnd(instr, failureValueType), instr);

        instr->InsertBefore(IR::BranchInstr::New(this->m_lowererMD.MDUncondBranchOpcode, labelDone, this->m_func));

        instr->InsertBefore(cmEqual);
        Lowerer::InsertMove(instr->GetDst(), this->LoadLibraryValueOpnd(instr, successValueType), instr);

        instr->InsertBefore(IR::BranchInstr::New(this->m_lowererMD.MDUncondBranchOpcode, labelDone, this->m_func));
    }

    instr->InsertBefore(labelHelper);
    instr->InsertAfter(labelDone);

    return true;
}